

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::While(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
        *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  eval_error *peVar5;
  allocator<char> local_69;
  File_Position local_68;
  Depth_Counter dc;
  string local_58;
  string local_38;
  
  Depth_Counter::Depth_Counter(&dc,this);
  puVar1 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_dataplus._M_p = (pointer)0x5;
  local_58._M_string_length = 0x4044d1;
  bVar3 = Keyword(this,(Static_String *)&local_58);
  if (!bVar3) {
LAB_003bddfb:
    (dc.parser)->m_current_parse_depth = (dc.parser)->m_current_parse_depth - 1;
    return bVar3;
  }
  bVar4 = Char(this,'(');
  if (!bVar4) {
    peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Incomplete \'while\' expression",&local_69);
    local_68.line = (this->m_position).line;
    local_68.column = (this->m_position).col;
    exception::eval_error::eval_error
              (peVar5,&local_58,&local_68,
               (this->m_filename).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  bVar4 = Operator(this,0);
  if (bVar4) {
    bVar4 = Char(this,')');
    if (bVar4) {
      do {
        bVar4 = Eol(this);
      } while (bVar4);
      bVar4 = Block(this);
      if (!bVar4) {
        peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"Incomplete \'while\' block",&local_69);
        local_68.line = (this->m_position).line;
        local_68.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (peVar5,&local_58,&local_68,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"",(allocator<char> *)&local_58);
      ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
      ::
      build_match<chaiscript::eval::While_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                  *)this,(long)puVar1 - (long)puVar2 >> 3,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      goto LAB_003bddfb;
    }
  }
  peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Incomplete \'while\' expression",&local_69);
  local_68.line = (this->m_position).line;
  local_68.column = (this->m_position).col;
  exception::eval_error::eval_error
            (peVar5,&local_58,&local_68,
             (this->m_filename).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

bool While() {
        Depth_Counter dc{this};
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("while")) {
          retval = true;

          if (!Char('(')) {
            throw exception::eval_error("Incomplete 'while' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          if (!(Operator() && Char(')'))) {
            throw exception::eval_error("Incomplete 'while' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          while (Eol()) {
          }

          if (!Block()) {
            throw exception::eval_error("Incomplete 'while' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::While_AST_Node<Tracer>>(prev_stack_top);
        }

        return retval;
      }